

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.cpp
# Opt level: O0

char * start_capture(MatchState *ms,char *s,char *p,int what)

{
  int iVar1;
  char *pcVar2;
  int level;
  char *res;
  int what_local;
  char *p_local;
  char *s_local;
  MatchState *ms_local;
  
  iVar1 = ms->level;
  if (0x1f < iVar1) {
    luaL_error(ms->L,"too many captures");
  }
  ms->capture[iVar1].init = s;
  ms->capture[iVar1].len = (long)what;
  ms->level = iVar1 + 1;
  pcVar2 = match(ms,s,p);
  if (pcVar2 == (char *)0x0) {
    ms->level = ms->level + -1;
  }
  return pcVar2;
}

Assistant:

static const char *start_capture (MatchState *ms, const char *s,
                                    const char *p, int what) {
  const char *res;
  int level = ms->level;
  if (level >= LUA_MAXCAPTURES) luaL_error(ms->L, "too many captures");
  ms->capture[level].init = s;
  ms->capture[level].len = what;
  ms->level = level+1;
  if ((res=match(ms, s, p)) == NULL)  /* match failed? */
    ms->level--;  /* undo capture */
  return res;
}